

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

shared_ptr<bytecode::CompiledFile> compile(shared_ptr<ScriptAstNode> *script)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<bytecode::CompiledFile> sVar1;
  shared_ptr<ScriptAstNode> *local_40;
  shared_ptr<compiler::AstCompiler> compiler;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<compiler::AstCompiler>();
  compiler.super___shared_ptr<compiler::AstCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RSI;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  in_RSI[1] = 0;
  *in_RSI = 0;
  ::compiler::AstCompiler::compile((AstCompiler *)script,local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&compiler);
  sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)script;
  return (shared_ptr<bytecode::CompiledFile>)
         sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<bytecode::CompiledFile> compile(std::shared_ptr<ScriptAstNode> script) {
  auto compiler = std::make_shared<compiler::AstCompiler>();
  return compiler->compile(std::move(script));
}